

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.hpp
# Opt level: O2

void __thiscall
nonstd::expected_lite::
expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~expected(expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this)

{
  if ((this->contained).
      super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value == true) {
    std::
    vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&(this->contained).
                  super_storage_t_impl<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0.m_value.names);
    return;
  }
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

~expected()
    {
        if ( has_value() ) contained.destruct_value();
        else               contained.destruct_error();
    }